

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator+=(String *this,double c)

{
  String *pSVar1;
  String local_28;
  double local_18;
  double c_local;
  String *this_local;
  
  local_18 = c;
  c_local = (double)this;
  Print((char *)&local_28,c,"%lg");
  pSVar1 = operator+=(this,&local_28);
  ~String(&local_28);
  return pSVar1;
}

Assistant:

const String& String::operator +=(const double c)
    {
#ifndef HasFloatParsing
        char buffer[15] = { 0 };
        ftoa((float)c, buffer, 6);
        return *this += buffer;
#else
        return *this += String::Print("%lg", c);
#endif
    }